

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int lws_ssl_capable_read_no_ssl(lws *wsi,uchar *buf,size_t len)

{
  int *piVar1;
  ssize_t sVar2;
  lws_log_cx *cx;
  socklen_t local_34;
  int local_30;
  socklen_t slt;
  int en;
  int n;
  size_t len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  slt = 0;
  _en = len;
  len_local = (size_t)buf;
  buf_local = (uchar *)wsi;
  piVar1 = __errno_location();
  *piVar1 = 0;
  if (*(long *)(buf_local + 0x380) == 0) {
    sVar2 = recv(*(int *)(buf_local + 0x450),(void *)len_local,_en,0);
    slt = (socklen_t)sVar2;
  }
  else {
    local_34 = 0x10;
    sVar2 = recvfrom(*(int *)(buf_local + 0x450),(void *)len_local,_en,0,
                     *(sockaddr **)(buf_local + 0x380),&local_34);
    slt = (socklen_t)sVar2;
  }
  piVar1 = __errno_location();
  local_30 = *piVar1;
  if ((int)slt < 0) {
    if (((local_30 == 0xb) || (local_30 == 0xb)) || (local_30 == 4)) {
      return -4;
    }
  }
  else if (((slt != 0) || ((*(ulong *)(buf_local + 0x46e) >> 0x23 & 1) == 0)) &&
          ((slt != 0 || ((*(ulong *)(buf_local + 0x46e) >> 0x23 & 1) != 0)))) {
    return slt;
  }
  cx = lwsl_wsi_get_cx((lws *)buf_local);
  _lws_log_cx(cx,lws_log_prepend_wsi,buf_local,8,"lws_ssl_capable_read_no_ssl",
              "error on reading from skt : %d, errno %d",slt,local_30);
  return -1;
}

Assistant:

int
lws_ssl_capable_read_no_ssl(struct lws *wsi, unsigned char *buf, size_t len)
{
	int n = 0, en;

	errno = 0;
#if defined(LWS_WITH_UDP)
	if (lws_wsi_is_udp(wsi)) {
		socklen_t slt = sizeof(wsi->udp->sa46);

		n = (int)recvfrom(wsi->desc.sockfd, (char *)buf,
#if defined(WIN32)
				(int)
#endif
				len, 0,
				sa46_sockaddr(&wsi->udp->sa46), &slt);
	} else
#endif
		n = (int)recv(wsi->desc.sockfd, (char *)buf,
#if defined(WIN32)
				(int)
#endif
				len, 0);
	en = LWS_ERRNO;
	if (n >= 0) {

		if (!n && wsi->unix_skt)
			goto do_err;

		/*
		 * See https://libwebsockets.org/
		 * pipermail/libwebsockets/2019-March/007857.html
		 */
		if (!n && !wsi->unix_skt)
			goto do_err;

#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_SERVER)
		if (wsi->a.vhost)
			lws_metric_event(wsi->a.vhost->mt_traffic_rx,
					 METRES_GO /* rx */, (unsigned int)n);
#endif

		return n;
	}

	if (en == LWS_EAGAIN ||
	    en == LWS_EWOULDBLOCK ||
	    en == LWS_EINTR)
		return LWS_SSL_CAPABLE_MORE_SERVICE;

do_err:
#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_SERVER)
	if (wsi->a.vhost)
		lws_metric_event(wsi->a.vhost->mt_traffic_rx, METRES_NOGO, 0u);
#endif

	lwsl_wsi_info(wsi, "error on reading from skt : %d, errno %d", n, en);

	return LWS_SSL_CAPABLE_ERROR;
}